

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

node_t primary_expression(void)

{
  int iVar1;
  node_t pvVar2;
  char *pcVar3;
  socklen_t *in_RDX;
  sockaddr *in_RSI;
  int unaff_retaddr;
  node_t n;
  node_t local_8;
  
  if (t->id == 0x86) {
    local_8 = identifier((char *)0x0);
    next();
  }
  else if (t->id == 0x87) {
    local_8 = constant(0);
    next();
  }
  else {
    iVar1 = accept(0x28,in_RSI,in_RDX);
    if (iVar1 != 0) {
      pvVar2 = expression();
      if (pvVar2 == (node_t)0x0) {
        pcVar3 = token_name(last_id);
        err(E,"expected expression after %s",pcVar3);
        sync();
      }
      else {
        iVar1 = expect(unaff_retaddr);
        if (iVar1 != 0) {
          return pvVar2;
        }
        sync();
      }
    }
    local_8 = (node_t)0x0;
  }
  return local_8;
}

Assistant:

node_t primary_expression()
{
    node_t n = NULL;

    if (t->id == IDENTIFIER)
    {
        n = identifier(t->string);
        next();
        return n;
    }
    else if (t->id == CONSTANT)
    {
        n = constant(t->constant);
        next();
        return n;
    }
    else if (accept('('))
    {
        if ((n = expression()))
        {
            if (expect(')'))
                return n;
            else
                sync(")");
        }
        else
        {
            err(E, "expected expression after %s", token_name(last_id));
            sync(")");
        }
    }

    return NULL;
}